

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O1

uint32_t av1_decode_frame_headers_and_setup
                   (AV1Decoder *pbi,aom_read_bit_buffer *rb,int trailing_bits_present)

{
  int32_t *piVar1;
  uint8_t uVar2;
  int other_h;
  RefCntBuffer *pRVar3;
  SequenceHeader *pSVar4;
  int iVar5;
  size_t sVar6;
  long lVar7;
  uint uVar8;
  FRAME_CONTEXT *__src;
  
  uVar2 = ((pbi->common).seq_params)->monochrome;
  lVar7 = 0;
  do {
    piVar1 = (int32_t *)((long)(pbi->common).global_motion[1].wmmat + lVar7 + 0x10);
    piVar1[0] = 0;
    piVar1[1] = 0x10000;
    *(undefined8 *)(piVar1 + 2) = 0;
    piVar1 = (int32_t *)((long)(pbi->common).global_motion[1].wmmat + lVar7);
    piVar1[0] = 0;
    piVar1[1] = 0;
    piVar1[2] = 0x10000;
    piVar1[3] = 0;
    *(undefined4 *)((long)(pbi->common).global_motion[1].wmmat + lVar7 + 0x20) = 0;
    pRVar3 = (pbi->common).cur_frame;
    piVar1 = (int32_t *)((long)pRVar3->global_motion[1].wmmat + lVar7);
    piVar1[0] = 0;
    piVar1[1] = 0;
    piVar1[2] = 0x10000;
    piVar1[3] = 0;
    piVar1 = (int32_t *)((long)pRVar3->global_motion[1].wmmat + lVar7 + 0x10);
    piVar1[0] = 0;
    piVar1[1] = 0x10000;
    *(undefined8 *)(piVar1 + 2) = 0;
    *(undefined4 *)((long)pRVar3->global_motion[1].wmmat + lVar7 + 0x20) = 0;
    lVar7 = lVar7 + 0x24;
  } while (lVar7 != 0xfc);
  (pbi->dcb).xd.global_motion = (pbi->common).global_motion;
  read_uncompressed_header(pbi,rb);
  if (trailing_bits_present != 0) {
    uVar8 = rb->bit_offset & 7;
    iVar5 = aom_rb_read_literal(rb,8 - uVar8);
    if (iVar5 != 1 << ((byte)uVar8 ^ 7)) {
      (pbi->error).error_code = AOM_CODEC_CORRUPT_FRAME;
    }
  }
  if (((pbi->common).tiles.single_tile_decoding == 0) &&
     ((-1 < pbi->dec_tile_row || (-1 < pbi->dec_tile_col)))) {
    pbi->dec_tile_row = -1;
    pbi->dec_tile_col = -1;
  }
  sVar6 = aom_rb_bytes_read(rb);
  pRVar3 = (pbi->common).cur_frame;
  (pbi->dcb).xd.cur_buf = &pRVar3->buf;
  if (((((pbi->common).current_frame.frame_type & 0xfd) == 0) &&
      ((pbi->common).features.allow_screen_content_tools == true)) &&
     ((pbi->common).features.allow_intrabc != false)) {
    iVar5 = (pRVar3->buf).field_2.field_0.y_crop_width;
    other_h = (pRVar3->buf).field_3.field_0.y_crop_height;
    av1_setup_scale_factors_for_frame(&(pbi->common).sf_identity,iVar5,other_h,iVar5,other_h);
  }
  if ((pbi->common).show_existing_frame == 0) {
    (*(pbi->common).mi_params.setup_mi)(&(pbi->common).mi_params);
    av1_calculate_ref_frame_side(&pbi->common);
    if ((pbi->common).features.allow_ref_frame_mvs == true) {
      av1_setup_motion_field(&pbi->common);
    }
    pSVar4 = (pbi->common).seq_params;
    av1_setup_block_planes
              ((MACROBLOCKD *)pbi,pSVar4->subsampling_x,pSVar4->subsampling_y,
               (uint)(uVar2 == '\0') * 2 + 1);
    if ((pbi->common).features.primary_ref_frame == 7) {
      __src = (pbi->common).default_frame_context;
    }
    else {
      uVar8 = (pbi->common).features.primary_ref_frame;
      iVar5 = -1;
      if ((uVar8 & 0xf8) == 0) {
        iVar5 = (pbi->common).remapped_ref_idx[uVar8 & 7];
      }
      __src = &(pbi->common).ref_frame_map[iVar5]->frame_context;
    }
    memcpy((pbi->common).fc,__src,0x52fc);
    if (((pbi->common).fc)->initialized == 0) {
      aom_internal_error(&pbi->error,AOM_CODEC_CORRUPT_FRAME,"Uninitialized entropy context.");
    }
    (pbi->dcb).corrupted = 0;
  }
  else if (pbi->reset_decoder_state != 0) {
    memcpy((pbi->common).fc,(pbi->common).default_frame_context,0x52fc);
    if (((pbi->common).fc)->initialized == 0) {
      aom_internal_error(&pbi->error,AOM_CODEC_CORRUPT_FRAME,"Uninitialized entropy context.");
    }
  }
  return (uint32_t)sVar6;
}

Assistant:

uint32_t av1_decode_frame_headers_and_setup(AV1Decoder *pbi,
                                            struct aom_read_bit_buffer *rb,
                                            int trailing_bits_present) {
  AV1_COMMON *const cm = &pbi->common;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *const xd = &pbi->dcb.xd;

#if CONFIG_BITSTREAM_DEBUG
  if (cm->seq_params->order_hint_info.enable_order_hint) {
    aom_bitstream_queue_set_frame_read(cm->current_frame.order_hint * 2 +
                                       cm->show_frame);
  } else {
    // This is currently used in RTC encoding. cm->show_frame is always 1.
    assert(cm->show_frame);
    aom_bitstream_queue_set_frame_read(cm->current_frame.frame_number);
  }
#endif
#if CONFIG_MISMATCH_DEBUG
  mismatch_move_frame_idx_r();
#endif

  for (int i = LAST_FRAME; i <= ALTREF_FRAME; ++i) {
    cm->global_motion[i] = default_warp_params;
    cm->cur_frame->global_motion[i] = default_warp_params;
  }
  xd->global_motion = cm->global_motion;

  read_uncompressed_header(pbi, rb);

  if (trailing_bits_present) av1_check_trailing_bits(pbi, rb);

  if (!cm->tiles.single_tile_decoding &&
      (pbi->dec_tile_row >= 0 || pbi->dec_tile_col >= 0)) {
    pbi->dec_tile_row = -1;
    pbi->dec_tile_col = -1;
  }

  const uint32_t uncomp_hdr_size =
      (uint32_t)aom_rb_bytes_read(rb);  // Size of the uncompressed header
  YV12_BUFFER_CONFIG *new_fb = &cm->cur_frame->buf;
  xd->cur_buf = new_fb;
  if (av1_allow_intrabc(cm)) {
    av1_setup_scale_factors_for_frame(
        &cm->sf_identity, xd->cur_buf->y_crop_width, xd->cur_buf->y_crop_height,
        xd->cur_buf->y_crop_width, xd->cur_buf->y_crop_height);
  }

  // Showing a frame directly.
  if (cm->show_existing_frame) {
    if (pbi->reset_decoder_state) {
      // Use the default frame context values.
      *cm->fc = *cm->default_frame_context;
      if (!cm->fc->initialized)
        aom_internal_error(&pbi->error, AOM_CODEC_CORRUPT_FRAME,
                           "Uninitialized entropy context.");
    }
    return uncomp_hdr_size;
  }

  cm->mi_params.setup_mi(&cm->mi_params);

  av1_calculate_ref_frame_side(cm);
  if (cm->features.allow_ref_frame_mvs) av1_setup_motion_field(cm);

  av1_setup_block_planes(xd, cm->seq_params->subsampling_x,
                         cm->seq_params->subsampling_y, num_planes);
  if (cm->features.primary_ref_frame == PRIMARY_REF_NONE) {
    // use the default frame context values
    *cm->fc = *cm->default_frame_context;
  } else {
    *cm->fc = get_primary_ref_frame_buf(cm)->frame_context;
  }
  if (!cm->fc->initialized)
    aom_internal_error(&pbi->error, AOM_CODEC_CORRUPT_FRAME,
                       "Uninitialized entropy context.");

  pbi->dcb.corrupted = 0;
  return uncomp_hdr_size;
}